

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O3

bool __thiscall MeCab::Writer::writeDump(Writer *this,Lattice *lattice,StringBuffer *os)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  StringBuffer *pSVar4;
  uint uVar5;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *__buf_12;
  void *__buf_13;
  void *extraout_RDX_01;
  void *pvVar6;
  void *__buf_14;
  void *__buf_15;
  void *extraout_RDX_02;
  long lVar7;
  long lVar3;
  
  iVar1 = (*lattice->_vptr_Lattice[8])(lattice);
  iVar2 = (*lattice->_vptr_Lattice[2])(lattice);
  lVar3 = CONCAT44(extraout_var,iVar2);
  do {
    if (lVar3 == 0) {
      return true;
    }
    pSVar4 = StringBuffer::operator<<(os,*(uint *)(lVar3 + 0x40));
    StringBuffer::write(pSVar4,0x20,__buf,in_RCX);
    if (*(char *)(lVar3 + 0x4f) == '\x03') {
      iVar2 = 0x1323a0;
LAB_0012cb10:
      StringBuffer::write(os,iVar2,__buf_00,in_RCX);
      pvVar6 = extraout_RDX;
    }
    else {
      if (*(char *)(lVar3 + 0x4f) == '\x02') {
        iVar2 = 0x13328f;
        goto LAB_0012cb10;
      }
      StringBuffer::write(os,(int)*(undefined8 *)(lVar3 + 0x30),
                          (void *)(ulong)*(ushort *)(lVar3 + 0x44),in_RCX);
      pvVar6 = extraout_RDX_00;
    }
    pSVar4 = (StringBuffer *)StringBuffer::write(os,0x20,pvVar6,in_RCX);
    pSVar4 = (StringBuffer *)
             StringBuffer::write(pSVar4,(int)*(undefined8 *)(lVar3 + 0x38),__buf_01,in_RCX);
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_02,in_RCX);
    pSVar4 = StringBuffer::operator<<(pSVar4,*(int *)(lVar3 + 0x30) - iVar1);
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_03,in_RCX);
    uVar5 = *(int *)(lVar3 + 0x30) - iVar1;
    in_RCX = (size_t)uVar5;
    pSVar4 = StringBuffer::operator<<(pSVar4,*(ushort *)(lVar3 + 0x44) + uVar5);
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_04,in_RCX);
    pSVar4 = StringBuffer::operator<<(pSVar4,*(unsigned_short *)(lVar3 + 0x48));
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_05,in_RCX);
    pSVar4 = StringBuffer::operator<<(pSVar4,*(unsigned_short *)(lVar3 + 0x4a));
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_06,in_RCX);
    pSVar4 = StringBuffer::operator<<(pSVar4,*(unsigned_short *)(lVar3 + 0x4c));
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_07,in_RCX);
    pSVar4 = StringBuffer::operator<<(pSVar4,(uint)*(byte *)(lVar3 + 0x4e));
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_08,in_RCX);
    pSVar4 = StringBuffer::operator<<(pSVar4,(uint)*(byte *)(lVar3 + 0x4f));
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_09,in_RCX);
    pSVar4 = StringBuffer::operator<<(pSVar4,(uint)*(byte *)(lVar3 + 0x50));
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_10,in_RCX);
    pSVar4 = StringBuffer::operator<<(pSVar4,(double)*(float *)(lVar3 + 0x54));
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_11,in_RCX);
    pSVar4 = StringBuffer::operator<<(pSVar4,(double)*(float *)(lVar3 + 0x58));
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_12,in_RCX);
    pSVar4 = StringBuffer::operator<<(pSVar4,(double)*(float *)(lVar3 + 0x5c));
    pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_13,in_RCX);
    StringBuffer::operator<<(pSVar4,*(long *)(lVar3 + 0x68));
    pvVar6 = extraout_RDX_01;
    for (lVar7 = *(long *)(lVar3 + 0x28); lVar7 != 0; lVar7 = *(long *)(lVar7 + 0x18)) {
      pSVar4 = (StringBuffer *)StringBuffer::write(os,0x20,pvVar6,in_RCX);
      in_RCX = *(size_t *)(lVar7 + 0x10);
      pSVar4 = StringBuffer::operator<<(pSVar4,*(uint *)(in_RCX + 0x40));
      pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x3a,__buf_14,in_RCX);
      pSVar4 = StringBuffer::operator<<(pSVar4,*(int *)(lVar7 + 0x20));
      pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x3a,__buf_15,in_RCX);
      StringBuffer::operator<<(pSVar4,(double)*(float *)(lVar7 + 0x24));
      pvVar6 = extraout_RDX_02;
    }
    StringBuffer::write(os,10,pvVar6,in_RCX);
    lVar3 = *(long *)(lVar3 + 8);
  } while( true );
}

Assistant:

bool Writer::writeDump(Lattice *lattice, StringBuffer *os) const {
  const char *str = lattice->sentence();
  for (const Node *node = lattice->bos_node(); node; node = node->next) {
    *os << node->id << ' ';
    if (node->stat == MECAB_BOS_NODE) {
      *os << "BOS";
    } else if (node->stat == MECAB_EOS_NODE) {
      *os << "EOS";
    } else {
      os->write(node->surface, node->length);
    }

    *os << ' ' << node->feature
        << ' ' << static_cast<int>(node->surface - str)
        << ' ' << static_cast<int>(node->surface - str + node->length)
        << ' ' << node->rcAttr
        << ' ' << node->lcAttr
        << ' ' << node->posid
        << ' ' << static_cast<int>(node->char_type)
        << ' ' << static_cast<int>(node->stat)
        << ' ' << static_cast<int>(node->isbest)
        << ' ' << node->alpha
        << ' ' << node->beta
        << ' ' << node->prob
        << ' ' << node->cost;

    for (const Path *path = node->lpath; path; path = path->lnext) {
      *os << ' ' << path->lnode->id << ':' << path->cost << ':' << path->prob;
    }
    *os << '\n';
  }
  return true;
}